

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O2

void CPP::writeIconAddFile
               (QTextStream *output,QString *indent,QString *iconName,QString *fileName,char *mode,
               char *state)

{
  QTextStream *pQVar1;
  long in_FS_OFFSET;
  _string<true> local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (QTextStream *)QTextStream::operator<<(output,indent);
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,iconName);
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,".addFile(");
  local_40.m_value = fileName;
  local_40.m_indent = indent;
  language::_string<true>::format(&local_40,pQVar1);
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,", QSize(), QIcon");
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,(QString *)language::qualifier);
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,"Mode");
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,(QString *)language::qualifier);
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,mode);
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,", QIcon");
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,(QString *)language::qualifier);
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,"State");
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,(QString *)language::qualifier);
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,state);
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,')');
  QTextStream::operator<<(pQVar1,(QString *)language::eol);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void writeIconAddFile(QTextStream &output, const QString &indent,
                             const QString &iconName, const QString &fileName,
                             const char *mode, const char *state)
{
    output << indent << iconName << ".addFile("
        << language::qstring(fileName, indent) << ", QSize(), QIcon"
        << language::qualifier << "Mode" << language::qualifier << mode
        << ", QIcon" << language::qualifier << "State" << language::qualifier << state
        << ')' << language::eol;
}